

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O1

DBKeyID __thiscall
anon_unknown.dwarf_4e43c7::SQLiteBuildDB::getKeyID
          (SQLiteBuildDB *this,KeyID keyID,string *error_out)

{
  int iVar1;
  value_type *pvVar2;
  value_type *pvVar3;
  iterator iVar4;
  DBKeyID dbKeyID;
  KeyType key;
  string local_70;
  DBKeyID local_50;
  KeyID local_48;
  long *local_40;
  undefined4 local_38;
  long local_30 [2];
  
  local_48._value = keyID._value;
  iVar4 = llvm::
          DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
          ::find((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                  *)&this->dbKeyIDs,&local_48);
  if (iVar4.Ptr != (this->dbKeyIDs).Buckets + (this->dbKeyIDs).NumBuckets) {
    return (DBKeyID)((iVar4.Ptr)->super_pair<llbuild::core::KeyID,_DBKeyID>).second.value;
  }
  (*this->delegate->_vptr_BuildDBDelegate[3])(&local_40,this->delegate,local_48._value);
  iVar1 = sqlite3_reset(this->findKeyIDForKeyStmt);
  if (((iVar1 == 0) && (iVar1 = sqlite3_clear_bindings(this->findKeyIDForKeyStmt), iVar1 == 0)) &&
     (iVar1 = sqlite3_bind_text(this->findKeyIDForKeyStmt,1,local_40,local_38,0), iVar1 == 0)) {
    iVar1 = sqlite3_step(this->findKeyIDForKeyStmt);
    if (iVar1 == 100) {
      iVar1 = sqlite3_column_count(this->findKeyIDForKeyStmt);
      if (iVar1 != 1) {
        __assert_fail("sqlite3_column_count(findKeyIDForKeyStmt) == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                      ,0x398,
                      "DBKeyID (anonymous namespace)::SQLiteBuildDB::getKeyIDFromDB(KeyID, std::string *)"
                     );
      }
      local_50.value = sqlite3_column_int64(this->findKeyIDForKeyStmt,0);
      goto LAB_001c21d8;
    }
    iVar1 = sqlite3_reset(this->insertIntoKeysStmt);
    if (((iVar1 == 0) && (iVar1 = sqlite3_clear_bindings(this->insertIntoKeysStmt), iVar1 == 0)) &&
       ((iVar1 = sqlite3_bind_text(this->insertIntoKeysStmt,1,local_40,local_38,0), iVar1 == 0 &&
        (iVar1 = sqlite3_step(this->insertIntoKeysStmt), iVar1 == 0x65)))) {
      local_50.value = sqlite3_last_insert_rowid(this->db);
      goto LAB_001c21d8;
    }
  }
  (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_70,this);
  std::__cxx11::string::operator=((string *)error_out,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_50.value = 0;
LAB_001c21d8:
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  if (local_50.value != 0) {
    pvVar2 = llvm::
             DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
             ::FindAndConstruct((DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                                 *)&this->engineKeyIDs,&local_50);
    (pvVar2->super_pair<DBKeyID,_llbuild::core::KeyID>).second._value = local_48._value;
    pvVar3 = llvm::
             DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
             ::FindAndConstruct((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                                 *)&this->dbKeyIDs,&local_48);
    (pvVar3->super_pair<llbuild::core::KeyID,_DBKeyID>).second.value = local_50.value;
  }
  return (DBKeyID)local_50.value;
}

Assistant:

DBKeyID getKeyID(KeyID keyID, std::string *error_out) {
    // Try to fetch the DBKeyID from the cache
    auto it = dbKeyIDs.find(keyID);
    if (it != dbKeyIDs.end()) {
      return it->second;
    }

    auto dbKeyID = getKeyIDFromDB(keyID, error_out);

    if (dbKeyID.value != 0) {
      // Cache the ID mappings
      engineKeyIDs[dbKeyID] = keyID;
      dbKeyIDs[keyID] = dbKeyID;
    }

    return dbKeyID;
  }